

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O3

BYTE VIRTUALConvertWinFlags(DWORD flProtect)

{
  uint uVar1;
  
  uVar1 = flProtect & 0xff;
  if (uVar1 < 0x10) {
    if (uVar1 == 1) {
      return '\x04';
    }
    if (uVar1 == 2) {
      return '\x01';
    }
    if (uVar1 == 4) {
      return '\x02';
    }
  }
  else {
    if (uVar1 == 0x10) {
      return '\x05';
    }
    if (uVar1 == 0x20) {
      return '\x06';
    }
    if (uVar1 == 0x40) {
      return '\x03';
    }
  }
  if (PAL_InitializeChakraCoreCalled) {
    return '\0';
  }
  abort();
}

Assistant:

static BYTE VIRTUALConvertWinFlags( IN DWORD flProtect )
{
    BYTE MemAccessControl = 0;

    switch ( flProtect & 0xff )
    {
    case PAGE_NOACCESS :
        MemAccessControl = VIRTUAL_NOACCESS;
        break;
    case PAGE_READONLY :
        MemAccessControl = VIRTUAL_READONLY;
        break;
    case PAGE_READWRITE :
        MemAccessControl = VIRTUAL_READWRITE;
        break;
    case PAGE_EXECUTE :
        MemAccessControl = VIRTUAL_EXECUTE;
        break;
    case PAGE_EXECUTE_READ :
        MemAccessControl = VIRTUAL_EXECUTE_READ;
        break;
    case PAGE_EXECUTE_READWRITE:
        MemAccessControl = VIRTUAL_EXECUTE_READWRITE;
        break;

    default :
        MemAccessControl = 0;
        ERROR( "Incorrect or no protection flags specified.\n" );
        break;
    }
    return MemAccessControl;
}